

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::LoadLWO2ShaderBlock(LWOImporter *this,SubChunkHeader *param_1,uint size)

{
  uint *puVar1;
  ShaderList *this_00;
  size_t *psVar2;
  char cVar3;
  pointer pSVar4;
  uint8_t *puVar5;
  uint uVar6;
  undefined8 __s1;
  int iVar7;
  uint8_t *puVar8;
  Logger *pLVar9;
  ulong uVar10;
  _Node *p_Var11;
  runtime_error *this_01;
  uint uVar12;
  uint *puVar13;
  char *sz;
  uint *puVar14;
  uint *puVar15;
  _List_node_base *p_Var16;
  Shader shader;
  long *local_a0 [2];
  long local_90 [2];
  pointer local_80;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  pSVar4 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->mSurfaces->
      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
      super__Vector_impl_data._M_start == pSVar4) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x2ab,
                  "void Assimp::LWOImporter::LoadLWO2ShaderBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  puVar13 = (uint *)(this->mFileBuffer + size);
  LWO::Shader::Shader((Shader *)local_78);
  puVar5 = this->mFileBuffer;
  puVar8 = puVar5;
  if (*puVar5 != '\0') {
    uVar12 = 1;
    do {
      puVar8 = puVar8 + 1;
      if (size < uVar12) {
        pLVar9 = DefaultLogger::get();
        Logger::warn(pLVar9,"LWO: Invalid file, string is is too long");
        puVar8 = this->mFileBuffer;
        break;
      }
      this->mFileBuffer = puVar8;
      uVar12 = uVar12 + 1;
    } while (*puVar8 != '\0');
  }
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,puVar5,puVar8);
  std::__cxx11::string::operator=((string *)local_78,(string *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  puVar15 = (uint *)(this->mFileBuffer + (2 - (ulong)((int)puVar8 - (int)puVar5 & 1)));
  this->mFileBuffer = (uint8_t *)puVar15;
  if ((char *)local_78._8_8_ == (char *)0x0) {
    pLVar9 = DefaultLogger::get();
    Logger::error(pLVar9,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::_M_replace((ulong)local_78,0,(char *)local_78._8_8_,0x6c4ff0);
    puVar15 = (uint *)this->mFileBuffer;
  }
  puVar14 = (uint *)((long)puVar15 + 6);
  local_80 = pSVar4;
  if (puVar14 < puVar13) {
    do {
      uVar12 = *puVar15;
      this->mFileBuffer = (uint8_t *)(puVar15 + 1);
      uVar6 = puVar15[1];
      this->mFileBuffer = (uint8_t *)puVar14;
      uVar10 = (ulong)(ushort)((ushort)uVar6 << 8 | (ushort)uVar6 >> 8);
      puVar1 = (uint *)(uVar10 + (long)puVar14);
      if (puVar13 < puVar1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"LWO2: Invalid shader header chunk length","");
        std::runtime_error::runtime_error(this_01,(string *)local_a0);
        *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      if (uVar12 == 0x46554e43) {
        cVar3 = (char)*puVar14;
        puVar15 = puVar14;
        while (cVar3 != '\0') {
          puVar15 = (uint *)((long)puVar15 + 1);
          iVar7 = (int)uVar10;
          uVar10 = (ulong)(iVar7 - 1);
          if (iVar7 == 0) {
            pLVar9 = DefaultLogger::get();
            Logger::warn(pLVar9,"LWO: Invalid file, string is is too long");
            puVar15 = (uint *)this->mFileBuffer;
            break;
          }
          this->mFileBuffer = (uint8_t *)puVar15;
          cVar3 = *(char *)puVar15;
        }
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,puVar14,puVar15);
        std::__cxx11::string::operator=((string *)&local_58,(string *)local_a0);
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar15 - (int)puVar14 & 1));
      }
      else if (uVar12 == 0x454e4142) {
        local_38 = (short)*puVar14 != 0;
        this->mFileBuffer = (uint8_t *)(puVar15 + 2);
      }
      this->mFileBuffer = (uint8_t *)puVar1;
      puVar14 = (uint *)((long)puVar1 + 6);
      puVar15 = puVar1;
    } while (puVar14 < puVar13);
  }
  __s1 = local_78._0_8_;
  pSVar4 = local_80;
  this_00 = &local_80[-1].mShaders;
  p_Var16 = (_List_node_base *)this_00;
  do {
    p_Var16 = (((_List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
               &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var16 == (_List_node_base *)this_00) {
      p_Var11 = std::__cxx11::list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>>::
                _M_create_node<Assimp::LWO::Shader_const&>
                          ((list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>> *)this_00,
                           (Shader *)local_78);
      goto LAB_004513fe;
    }
    iVar7 = strcmp((char *)__s1,*(char **)(p_Var16 + 1));
  } while (-1 < iVar7);
  p_Var11 = std::__cxx11::list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>>::
            _M_create_node<Assimp::LWO::Shader_const&>
                      ((list<Assimp::LWO::Shader,std::allocator<Assimp::LWO::Shader>> *)this_00,
                       (Shader *)local_78);
LAB_004513fe:
  std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
  psVar2 = &pSVar4[-1].mShaders.
            super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>._M_impl.
            _M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2ShaderBlock(LE_NCONST IFF::SubChunkHeader* /*head*/, unsigned int size )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Shader shader;

    // get the ordinal string
    GetS0( shader.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!shader.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        shader.ordinal = "\x00";
    }

    // read the header
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid shader header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_ENAB:
            shader.enabled = GetU2() ? true : false;
            break;

        case AI_LWO_FUNC:
            GetS0( shader.functionName, head.length );
        }
        mFileBuffer = next;
    }

    // now attach the shader to the parent surface - sort by ordinal string
    for (ShaderList::iterator it = surf.mShaders.begin();it != surf.mShaders.end(); ++it)   {
        if (::strcmp(shader.ordinal.c_str(),(*it).ordinal.c_str()) < 0) {
            surf.mShaders.insert(it,shader);
            return;
        }
    }
    surf.mShaders.push_back(shader);
}